

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::DescriptorChecksum_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Span<const_char> *span)

{
  char *pcVar1;
  string *psVar2;
  _Alloc_hider __s;
  size_type __n;
  int iVar3;
  int j;
  void *pvVar4;
  string *extraout_RAX;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int val;
  uint64_t c;
  char *pcVar9;
  long in_FS_OFFSET;
  
  psVar2 = *(string **)(in_FS_OFFSET + 0x28);
  if ((DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                   INPUT_CHARSET_abi_cxx11_), iVar7 != 0)) {
    DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_._M_dataplus._M_p
         = (pointer)&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_
                     .field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_,
               "0123456789()[],\'/*abcdefgh@:$%{}IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~ijklmnopqrstuvwxyzABCDEFGH`#\"\\ "
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                         INPUT_CHARSET_abi_cxx11_);
  }
  if ((DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_ == '\0')
     && (iVar7 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                      CHECKSUM_CHARSET_abi_cxx11_), iVar7 != 0)) {
    DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                     CHECKSUM_CHARSET_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_,
               "qpzry9x8gf2tvdw0s3jn54khce6mua7l","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                         CHECKSUM_CHARSET_abi_cxx11_);
  }
  __n = DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_.
        _M_string_length;
  __s._M_p = DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_.
             _M_dataplus._M_p;
  lVar5 = *(long *)(this + 8);
  if (lVar5 == 0) {
    c = 1;
LAB_00159c01:
    iVar7 = 8;
    do {
      c = anon_unknown.dwarf_29c3b1::PolyMod(c,0);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x2020202020202020;
    __return_storage_ptr__->_M_string_length = 8;
    (__return_storage_ptr__->field_2)._M_local_buf[8] = '\0';
    lVar6 = 0x23;
    lVar5 = 0;
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar5] =
           DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_.
           _M_dataplus._M_p[(uint)((c ^ 1) >> ((byte)lVar6 & 0x3f)) & 0x1f];
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + -5;
    } while (lVar6 != -5);
    if (*(string **)(in_FS_OFFSET + 0x28) == psVar2) {
      return *(string **)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    if (DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_.
        _M_string_length != 0) {
      pcVar9 = *(char **)this;
      pvVar4 = memchr(DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                      INPUT_CHARSET_abi_cxx11_._M_dataplus._M_p,(int)*pcVar9,
                      DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                      INPUT_CHARSET_abi_cxx11_._M_string_length);
      uVar8 = (long)pvVar4 - (long)__s._M_p;
      if (uVar8 != 0xffffffffffffffff && pvVar4 != (void *)0x0) {
        pcVar1 = pcVar9 + lVar5;
        c = 1;
        iVar7 = 0;
        val = 0;
        do {
          c = anon_unknown.dwarf_29c3b1::PolyMod(c,(uint)uVar8 & 0x1f);
          val = (int)(uVar8 >> 5) + val * 3;
          if (iVar7 + 1 == 3) {
            c = anon_unknown.dwarf_29c3b1::PolyMod(c,val);
            val = 0;
            iVar3 = 0;
            if (pcVar9 + 1 == pcVar1) goto LAB_00159c01;
          }
          else {
            iVar3 = iVar7 + 1;
            if (pcVar9 + 1 == pcVar1) {
              if (-1 < iVar7) {
                c = anon_unknown.dwarf_29c3b1::PolyMod(c,val);
              }
              goto LAB_00159c01;
            }
          }
          iVar7 = iVar3;
          pcVar9 = pcVar9 + 1;
          pvVar4 = memchr(__s._M_p,(int)*pcVar9,__n);
        } while ((pvVar4 != (void *)0x0) &&
                (uVar8 = (long)pvVar4 - (long)__s._M_p, uVar8 != 0xffffffffffffffff));
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(string **)(in_FS_OFFSET + 0x28) == psVar2) {
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return extraout_RAX;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string DescriptorChecksum(const Span<const char>& span)
{
    /** A character set designed such that:
     *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
     *  - Case errors cause an offset that's a multiple of 32.
     *  - As many alphabetic characters are in the same group (while following the above restrictions).
     *
     * If p(x) gives the position of a character c in this character set, every group of 3 characters
     * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
     * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
     * affect a single symbol.
     *
     * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
     * the position within the groups.
     */
    static const std::string INPUT_CHARSET =
        "0123456789()[],'/*abcdefgh@:$%{}"
        "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
        "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

    /** The character set for the checksum itself (same as bech32). */
    static const std::string CHECKSUM_CHARSET = "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

    uint64_t c = 1;
    int cls = 0;
    int clscount = 0;
    for (auto ch : span) {
        auto pos = INPUT_CHARSET.find(ch);
        if (pos == std::string::npos) return "";
        c = PolyMod(c, pos & 31); // Emit a symbol for the position inside the group, for every character.
        cls = cls * 3 + (pos >> 5); // Accumulate the group numbers
        if (++clscount == 3) {
            // Emit an extra symbol representing the group numbers, for every 3 characters.
            c = PolyMod(c, cls);
            cls = 0;
            clscount = 0;
        }
    }
    if (clscount > 0) c = PolyMod(c, cls);
    for (int j = 0; j < 8; ++j) c = PolyMod(c, 0); // Shift further to determine the checksum.
    c ^= 1; // Prevent appending zeroes from not affecting the checksum.

    std::string ret(8, ' ');
    for (int j = 0; j < 8; ++j) ret[j] = CHECKSUM_CHARSET[(c >> (5 * (7 - j))) & 31];
    return ret;
}